

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O2

MaybeResult<unsigned_long> *
wasm::WATParser::results<wasm::WATParser::ParseDeclsCtx>
          (MaybeResult<unsigned_long> *__return_storage_ptr__,ParseDeclsCtx *ctx)

{
  _Variant_storage<false,_wasm::Ok,_wasm::Err> *this;
  bool bVar1;
  bool bVar2;
  long lVar3;
  string_view expected;
  undefined1 local_b0 [8];
  Result<wasm::Ok> type;
  Result<wasm::Ok> _val;
  
  lVar3 = 0;
  this = (_Variant_storage<false,_wasm::Ok,_wasm::Err> *)
         ((long)&type.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20);
  bVar2 = false;
  do {
    expected._M_str = "result";
    expected._M_len = 6;
    bVar1 = Lexer::takeSExprStart(&ctx->in,expected);
    if (!bVar1) {
      if (bVar2) {
        *(long *)&(__return_storage_ptr__->val).
                  super__Variant_base<unsigned_long,_wasm::None,_wasm::Err>.
                  super__Move_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
                  super__Copy_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
                  super__Move_ctor_alias<unsigned_long,_wasm::None,_wasm::Err>.
                  super__Copy_ctor_alias<unsigned_long,_wasm::None,_wasm::Err>.
                  super__Variant_storage_alias<unsigned_long,_wasm::None,_wasm::Err> = lVar3;
        *(__index_type *)
         ((long)&(__return_storage_ptr__->val).
                 super__Variant_base<unsigned_long,_wasm::None,_wasm::Err>.
                 super__Move_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
                 super__Copy_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
                 super__Move_ctor_alias<unsigned_long,_wasm::None,_wasm::Err>.
                 super__Copy_ctor_alias<unsigned_long,_wasm::None,_wasm::Err>.
                 super__Variant_storage_alias<unsigned_long,_wasm::None,_wasm::Err> + 0x20) = '\0';
      }
      else {
        *(__index_type *)
         ((long)&(__return_storage_ptr__->val).
                 super__Variant_base<unsigned_long,_wasm::None,_wasm::Err>.
                 super__Move_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
                 super__Copy_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
                 super__Move_ctor_alias<unsigned_long,_wasm::None,_wasm::Err>.
                 super__Copy_ctor_alias<unsigned_long,_wasm::None,_wasm::Err>.
                 super__Variant_storage_alias<unsigned_long,_wasm::None,_wasm::Err> + 0x20) = '\x01'
        ;
      }
      return __return_storage_ptr__;
    }
    while (bVar2 = Lexer::takeRParen(&ctx->in), !bVar2) {
      valtype<wasm::WATParser::ParseDeclsCtx>((Result<wasm::Ok> *)local_b0,ctx);
      std::__detail::__variant::_Copy_ctor_base<false,_wasm::Ok,_wasm::Err>::_Copy_ctor_base
                ((_Copy_ctor_base<false,_wasm::Ok,_wasm::Err> *)this,
                 (_Copy_ctor_base<false,_wasm::Ok,_wasm::Err> *)local_b0);
      if (_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._24_1_ == '\x01') {
        std::__cxx11::string::string
                  ((string *)
                   ((long)&_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                           super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20),
                   (string *)
                   ((long)&type.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                           super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
        std::__detail::__variant::_Variant_storage<false,unsigned_long,wasm::None,wasm::Err>::
        _Variant_storage<2ul,wasm::Err>
                  ((_Variant_storage<false,unsigned_long,wasm::None,wasm::Err> *)
                   __return_storage_ptr__,
                   (__index_type *)
                   ((long)&_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                           super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
        std::__cxx11::string::~string
                  ((string *)
                   ((long)&_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                           super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
        std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
                  ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)
                   ((long)&type.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                           super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
        std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
                  ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)local_b0);
        return __return_storage_ptr__;
      }
      std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
                (this);
      lVar3 = lVar3 + 1;
      std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
                ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)local_b0);
    }
    bVar2 = true;
  } while( true );
}

Assistant:

MaybeResult<typename Ctx::ResultsT> results(Ctx& ctx) {
  bool hasAny = false;
  auto res = ctx.makeResults();
  while (ctx.in.takeSExprStart("result"sv)) {
    hasAny = true;
    while (!ctx.in.takeRParen()) {
      auto type = valtype(ctx);
      CHECK_ERR(type);
      ctx.appendResult(res, *type);
    }
  }
  if (hasAny) {
    return res;
  }
  return {};
}